

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValue<Imath_3_2::Matrix33<double>>(Matrix33<double> *A)

{
  double *pdVar1;
  long lVar2;
  BaseType_conflict3 BVar3;
  double *pdVar4;
  long lVar5;
  TV maxV;
  TV minV;
  TV S;
  Matrix33<double> A1;
  Matrix33<double> V;
  Matrix33<double> U;
  Vec3 local_170 [24];
  Vec3 local_158 [24];
  Matrix33 local_140 [72];
  Matrix33 local_f8 [72];
  undefined8 local_b0;
  undefined8 local_a8;
  double adStack_a0 [7];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_68 = 0x3ff0000000000000;
  local_50 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_48 = 0x3ff0000000000000;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  local_b0 = 0x3ff0000000000000;
  adStack_a0[1] = 0.0;
  local_28 = 0x3ff0000000000000;
  local_a8 = 0;
  adStack_a0[0] = 0.0;
  adStack_a0[2] = 1.0;
  adStack_a0[3] = 0.0;
  adStack_a0[4] = 0.0;
  adStack_a0[5] = 0.0;
  adStack_a0[6] = 1.0;
  BVar3 = computeThreshold<Imath_3_2::Matrix33<double>>(A);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)local_f8,A);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>(local_f8,local_158)
  ;
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)local_140,A);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
            (local_140,local_170);
  Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)local_f8,A);
  lVar5 = 0;
  Imath_3_2::jacobiSVD<double>
            (local_f8,(Matrix33 *)&local_68,(Vec3 *)local_140,(Matrix33 *)&local_b0,
             2.220446049250313e-16,false);
  pdVar4 = adStack_a0;
  while( true ) {
    if (lVar5 == 3) {
      return;
    }
    if (BVar3 <= ABS(*(double *)(local_158 + lVar5 * 8) - *pdVar4)) break;
    lVar2 = lVar5 * 8;
    pdVar1 = pdVar4 + -2;
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 3;
    if (BVar3 <= ABS(*(double *)(local_170 + lVar2) - *pdVar1)) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]"
                   );
    }
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix33<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}